

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_store_srsgpr(TCGContext_conflict6 *tcg_ctx,int from,int to)

{
  TCGTemp *a1;
  TCGTemp *a1_00;
  TCGTemp *a1_01;
  uintptr_t o;
  uintptr_t o_3;
  uintptr_t o_1;
  uintptr_t o_2;
  TCGv_i32 ret;
  
  if (to != 0) {
    a1 = tcg_temp_new_internal_mips64el(tcg_ctx,TCG_TYPE_I64,false);
    a1_00 = tcg_temp_new_internal_mips64el(tcg_ctx,TCG_TYPE_I32,false);
    ret = (TCGv_i32)((long)a1_00 - (long)tcg_ctx);
    a1_01 = tcg_temp_new_internal_mips64el(tcg_ctx,TCG_TYPE_I64,false);
    if (from == 0) {
      tcg_gen_op2_mips64el(tcg_ctx,INDEX_op_movi_i64,(TCGArg)a1,0);
    }
    else if (tcg_ctx->cpu_gpr[from] != (TCGv_i64)((long)a1 - (long)tcg_ctx)) {
      tcg_gen_op2_mips64el
                (tcg_ctx,INDEX_op_mov_i64,(TCGArg)a1,
                 (TCGArg)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[from]));
    }
    tcg_gen_op3_mips64el
              (tcg_ctx,INDEX_op_ld_i32,(TCGArg)a1_00,(TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),
               0x694);
    tcg_gen_shri_i32_mips64el(tcg_ctx,ret,ret,6);
    tcg_gen_andi_i32_mips64el(tcg_ctx,ret,ret,0xf);
    tcg_gen_muli_i32_mips64el(tcg_ctx,ret,ret,0x100);
    tcg_gen_ext_i32_i64_mips64el(tcg_ctx,(TCGv_i64)((long)a1_01 - (long)tcg_ctx),ret);
    tcg_gen_op3_mips64el
              (tcg_ctx,INDEX_op_add_i64,(TCGArg)a1_01,(TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),
               (TCGArg)a1_01);
    tcg_gen_op3_mips64el(tcg_ctx,INDEX_op_st_i64,(TCGArg)a1,(TCGArg)a1_01,(ulong)(uint)to << 3);
    tcg_temp_free_internal_mips64el
              (tcg_ctx,(TCGTemp *)((TCGv_i64)((long)a1_01 - (long)tcg_ctx) + (long)tcg_ctx));
    tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
    tcg_temp_free_internal_mips64el
              (tcg_ctx,(TCGTemp *)((TCGv_i64)((long)a1 - (long)tcg_ctx) + (long)tcg_ctx));
    return;
  }
  return;
}

Assistant:

static inline void gen_store_srsgpr(TCGContext *tcg_ctx, int from, int to)
{
    if (to != 0) {
        TCGv t0 = tcg_temp_new(tcg_ctx);
        TCGv_i32 t2 = tcg_temp_new_i32(tcg_ctx);
        TCGv_ptr addr = tcg_temp_new_ptr(tcg_ctx);

        gen_load_gpr(tcg_ctx, t0, from);
        tcg_gen_ld_i32(tcg_ctx, t2, tcg_ctx->cpu_env, offsetof(CPUMIPSState, CP0_SRSCtl));
        tcg_gen_shri_i32(tcg_ctx, t2, t2, CP0SRSCtl_PSS);
        tcg_gen_andi_i32(tcg_ctx, t2, t2, 0xf);
        tcg_gen_muli_i32(tcg_ctx, t2, t2, sizeof(target_ulong) * 32);
        tcg_gen_ext_i32_ptr(tcg_ctx, addr, t2);
        tcg_gen_add_ptr(tcg_ctx, addr, tcg_ctx->cpu_env, addr);

        tcg_gen_st_tl(tcg_ctx, t0, addr, sizeof(target_ulong) * to);
        tcg_temp_free_ptr(tcg_ctx, addr);
        tcg_temp_free_i32(tcg_ctx, t2);
        tcg_temp_free(tcg_ctx, t0);
    }
}